

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanscalar.cpp
# Opt level: O2

string * __thiscall
YAML::ScanScalar_abi_cxx11_
          (string *__return_storage_ptr__,YAML *this,Stream *INPUT,ScanScalarParams *params)

{
  CharacterSet CVar1;
  bool bVar2;
  string *psVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  RegEx *pRVar11;
  ulong uVar12;
  ParserException *pPVar13;
  Stream *in;
  undefined7 uVar15;
  string *psVar14;
  ulong uVar16;
  size_type sVar17;
  bool bVar18;
  bool local_8a;
  allocator local_89;
  string *local_88;
  uint local_80;
  undefined4 local_7c;
  ulong local_78;
  size_type local_70;
  Mark local_68;
  ulong local_58;
  string local_50;
  
  bVar18 = INPUT->m_charSet == utf16be;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  *(undefined1 *)
   &(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur = 0;
  local_88 = __return_storage_ptr__;
  if (INPUT->m_input == (istream *)0x0) {
    pRVar11 = Exp::Empty();
    INPUT->m_input = (istream *)pRVar11;
  }
  local_78 = 0;
  local_70 = 0xffffffffffffffff;
  local_58 = 0;
  local_80 = 0;
  uVar15 = 0;
  bVar2 = false;
  local_8a = false;
LAB_006a76cf:
  bVar4 = Stream::operator_cast_to_bool((Stream *)this);
  if (!bVar4) goto LAB_006a7bb0;
  sVar17 = local_88->_M_string_length;
  while (bVar4 = RegEx::Matches((RegEx *)INPUT->m_input,(Stream *)this), !bVar4) {
    pRVar11 = Exp::Break();
    bVar4 = RegEx::Matches(pRVar11,(Stream *)this);
    if ((bVar4) || (bVar4 = Stream::operator!((Stream *)this), bVar4)) break;
    if (*(int *)(this + 0x10) == 0) {
      pRVar11 = Exp::DocIndicator();
      bVar4 = RegEx::Matches(pRVar11,(Stream *)this);
      if (bVar4) {
        iVar8 = (int)(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                     super__Deque_impl_data._M_map_size;
        if (iVar8 == 1) break;
        if (iVar8 == 2) {
          pPVar13 = (ParserException *)__cxa_allocate_exception(0x40);
          local_68._0_8_ = *(undefined8 *)(this + 8);
          local_68.column = *(int *)(this + 0x10);
          std::__cxx11::string::string
                    ((string *)&local_50,"illegal document indicator in scalar",&local_89);
          ParserException::ParserException(pPVar13,&local_68,&local_50);
          __cxa_throw(pPVar13,&ParserException::typeinfo,BadConversion::~BadConversion);
        }
      }
    }
    if (*(char *)((long)&(INPUT->m_mark).column + 2) == '\\') {
      pRVar11 = Exp::EscBreak();
      bVar18 = RegEx::Matches(pRVar11,(Stream *)this);
      if (bVar18) {
        Stream::get((Stream *)this);
        sVar17 = local_88->_M_string_length;
        local_7c = (undefined4)CONCAT71((int7)((ulong)local_88 >> 8),1);
        bVar18 = true;
        bVar2 = true;
        local_70 = sVar17;
        goto LAB_006a780a;
      }
    }
    cVar5 = Stream::peek((Stream *)this);
    if (cVar5 == *(char *)((long)&(INPUT->m_mark).column + 2)) {
      Exp::Escape_abi_cxx11_(&local_50,(Exp *)this,in);
      psVar3 = local_88;
      std::__cxx11::string::append((string *)local_88);
      std::__cxx11::string::~string((string *)&local_50);
      sVar17 = psVar3->_M_string_length;
      bVar18 = true;
      uVar15 = (undefined7)((ulong)psVar3 >> 8);
      bVar2 = true;
      local_70 = sVar17;
    }
    else {
      cVar5 = Stream::get((Stream *)this);
      std::__cxx11::string::push_back((char)local_88);
      bVar2 = true;
      bVar18 = true;
      if ((cVar5 != '\t') && (bVar2 = true, bVar18 = true, cVar5 != ' ')) {
        sVar17 = local_88->_M_string_length;
        bVar2 = true;
      }
    }
  }
  local_7c = 0;
LAB_006a780a:
  bVar4 = Stream::operator!((Stream *)this);
  if (bVar4) {
    if ((char)(INPUT->m_mark).pos == '\x01') {
      pPVar13 = (ParserException *)__cxa_allocate_exception(0x40);
      local_68._0_8_ = *(undefined8 *)(this + 8);
      local_68.column = *(int *)(this + 0x10);
      std::__cxx11::string::string((string *)&local_50,"illegal EOF in scalar",&local_89);
      ParserException::ParserException(pPVar13,&local_68,&local_50);
      __cxa_throw(pPVar13,&ParserException::typeinfo,BadConversion::~BadConversion);
    }
    goto LAB_006a7bb0;
  }
  if (((int)(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_map_size == 1) && (*(int *)(this + 0x10) == 0)) {
    pRVar11 = Exp::DocIndicator();
    bVar4 = RegEx::Matches(pRVar11,(Stream *)this);
    if (bVar4) goto LAB_006a7bb0;
  }
  iVar8 = RegEx::Match((RegEx *)INPUT->m_input,(Stream *)this);
  if (-1 < iVar8) {
    if ((char)(INPUT->m_mark).pos == '\x01') {
      Stream::eat((Stream *)this,iVar8);
    }
    goto LAB_006a7bb0;
  }
  if (INPUT->m_charSet == utf16be) {
    std::__cxx11::string::erase((ulong)local_88,sVar17);
  }
  pRVar11 = Exp::Break();
  iVar8 = RegEx::Match(pRVar11,(Stream *)this);
  Stream::eat((Stream *)this,iVar8);
  while ((cVar5 = Stream::peek((Stream *)this), cVar5 == ' ' &&
         (((*(int *)(this + 0x10) < (INPUT->m_mark).line ||
           (((char)(INPUT->m_mark).column == '\x01' && (!bVar2)))) &&
          (bVar4 = RegEx::Matches((RegEx *)INPUT->m_input,(Stream *)this), !bVar4))))) {
    Stream::eat((Stream *)this,1);
  }
  if (((char)(INPUT->m_mark).column == '\x01') && (!bVar2)) {
    iVar8 = (INPUT->m_mark).line;
    iVar9 = *(int *)(this + 0x10);
    if (*(int *)(this + 0x10) < iVar8) {
      iVar9 = iVar8;
    }
    (INPUT->m_mark).line = iVar9;
  }
  while( true ) {
    pRVar11 = Exp::Blank();
    bVar4 = RegEx::Matches(pRVar11,(Stream *)this);
    if (!bVar4) break;
    cVar5 = Stream::peek((Stream *)this);
    if (((cVar5 == '\t') && (*(int *)(this + 0x10) < (INPUT->m_mark).line)) &&
       (*(int *)((long)&(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                        super__Deque_impl_data._M_map_size + 4) == 2)) {
      pPVar13 = (ParserException *)__cxa_allocate_exception(0x40);
      local_68._0_8_ = *(undefined8 *)(this + 8);
      local_68.column = *(int *)(this + 0x10);
      std::__cxx11::string::string
                ((string *)&local_50,"illegal tab when looking for indentation",&local_89);
      ParserException::ParserException(pPVar13,&local_68,&local_50);
      __cxa_throw(pPVar13,&ParserException::typeinfo,BadConversion::~BadConversion);
    }
    if ((*(char *)((long)&(INPUT->m_mark).column + 1) != '\x01') ||
       (bVar4 = RegEx::Matches((RegEx *)INPUT->m_input,(Stream *)this), bVar4)) break;
    Stream::eat((Stream *)this,1);
  }
  pRVar11 = Exp::Break();
  bVar4 = RegEx::Matches(pRVar11,(Stream *)this);
  pRVar11 = Exp::Blank();
  bVar6 = RegEx::Matches(pRVar11,(Stream *)this);
  CVar1 = INPUT->m_charSet;
  uVar16 = (ulong)CVar1;
  uVar10 = (uint)local_8a;
  if (CVar1 != utf16le || (int)local_78 != 0) {
    uVar10 = (uint)(byte)local_58;
  }
  if (!bVar4) {
    uVar10 = (uint)(byte)local_58;
  }
  local_58 = (ulong)uVar10;
  if (bVar18) {
    if (CVar1 == utf16be) {
      if (bVar4) {
        local_80 = 1;
        std::__cxx11::string::append((char *)local_88);
        bVar18 = true;
        local_8a = bVar6;
        goto LAB_006a76cf;
      }
      if ((((byte)local_7c | (byte)local_80) & 1) == 0) {
        std::__cxx11::string::append((char *)local_88);
      }
      goto LAB_006a7ad7;
    }
    if (CVar1 == utf16le) {
      if ((local_8a == false && !bVar6) && ((local_80 & 1) == 0 && !bVar4)) {
        if (*(int *)(this + 0x10) < (INPUT->m_mark).line && bVar4) goto LAB_006a7b1b;
      }
      else if (bVar4) {
LAB_006a7b1b:
        uVar10 = (int)local_78 + 1;
        local_78 = (ulong)uVar10;
        local_80 = (uint)CONCAT71((uint7)(uint3)(uVar10 >> 8),1);
        bVar18 = true;
        local_8a = bVar6;
        goto LAB_006a76cf;
      }
      uVar16 = std::__cxx11::string::append((char *)local_88);
      uVar16 = uVar16 & 0xffffffffffffff00;
      if (0 < (int)local_78 && !bVar4) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_50,(char)local_78 + -1);
        std::__cxx11::string::append((string *)local_88);
        std::__cxx11::string::~string((string *)&local_50);
        if (((local_58 & 1) != 0) ||
           (uVar16 = CONCAT71(uVar15,~bVar2) & 0xffffff01, bVar7 = (byte)uVar16 | bVar6,
           uVar16 = CONCAT71((int7)(uVar16 >> 8),bVar7), bVar7 != 0)) {
          uVar16 = std::__cxx11::string::append((char *)local_88);
        }
        local_78 = 0;
      }
      goto LAB_006a79ff;
    }
    if (CVar1 == utf8) {
      uVar16 = std::__cxx11::string::append((char *)local_88);
    }
  }
LAB_006a79ff:
  local_80 = (uint)CONCAT71((int7)(uVar16 >> 8),1);
  bVar18 = true;
  local_8a = bVar6;
  if (bVar4) goto LAB_006a76cf;
LAB_006a7ad7:
  bVar18 = true;
  local_80 = 0;
  local_8a = bVar6;
  if (*(int *)(this + 0x10) < (INPUT->m_mark).line) {
    *(undefined1 *)
     &(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur = 1;
LAB_006a7bb0:
    psVar3 = local_88;
    if (*(char *)&(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                  super__Deque_impl_data._M_map == '\x01') {
      uVar12 = std::__cxx11::string::find_last_not_of((char *)local_88,0x6eb636);
      uVar16 = local_70;
      if (local_70 < uVar12) {
        uVar16 = uVar12;
      }
      if (uVar12 == 0xffffffffffffffff) {
        uVar16 = local_70;
      }
      if (local_70 == 0xffffffffffffffff) {
        uVar16 = uVar12;
      }
      if (uVar16 < psVar3->_M_string_length) {
        std::__cxx11::string::erase((ulong)local_88,uVar16 + 1);
      }
    }
    psVar3 = local_88;
    iVar8 = *(int *)((long)&(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                            _M_impl.super__Deque_impl_data._M_map + 4);
    if (iVar8 == -1) {
      uVar12 = std::__cxx11::string::find_last_not_of((char)local_88,10);
      psVar14 = local_88;
      uVar16 = local_70;
      if (local_70 < uVar12) {
        uVar16 = uVar12;
      }
      if (uVar12 == 0xffffffffffffffff) {
        uVar16 = local_70;
      }
      if (local_70 == 0xffffffffffffffff) {
        uVar16 = uVar12;
      }
      if (uVar16 == 0xffffffffffffffff) {
        uVar16 = 0;
      }
      else {
        if (psVar3->_M_string_length <= uVar16) {
          return psVar3;
        }
        uVar16 = uVar16 + 1;
      }
      std::__cxx11::string::erase((ulong)local_88,uVar16);
    }
    else {
      psVar14 = local_88;
      if (iVar8 == 0) {
        uVar12 = std::__cxx11::string::find_last_not_of((char)local_88,10);
        psVar14 = local_88;
        uVar16 = local_70;
        if (local_70 < uVar12) {
          uVar16 = uVar12;
        }
        if (uVar12 == 0xffffffffffffffff) {
          uVar16 = local_70;
        }
        if (local_70 == 0xffffffffffffffff) {
          uVar16 = uVar12;
        }
        if (uVar16 == 0xffffffffffffffff) {
          uVar16 = 0;
        }
        else {
          if (psVar3->_M_string_length <= uVar16 + 1) {
            return psVar3;
          }
          uVar16 = uVar16 + 2;
        }
        std::__cxx11::string::erase((ulong)local_88,uVar16);
      }
    }
    return psVar14;
  }
  goto LAB_006a76cf;
}

Assistant:

std::string ScanScalar(Stream& INPUT, ScanScalarParams& params) {
  bool foundNonEmptyLine = false;
  bool pastOpeningBreak = (params.fold == FOLD_FLOW);
  bool emptyLine = false, moreIndented = false;
  int foldedNewlineCount = 0;
  bool foldedNewlineStartedMoreIndented = false;
  std::size_t lastEscapedChar = std::string::npos;
  std::string scalar;
  params.leadingSpaces = false;

  if (!params.end) {
    params.end = &Exp::Empty();
  }

  while (INPUT) {
    // ********************************
    // Phase #1: scan until line ending

    std::size_t lastNonWhitespaceChar = scalar.size();
    bool escapedNewline = false;
    while (!params.end->Matches(INPUT) && !Exp::Break().Matches(INPUT)) {
      if (!INPUT) {
        break;
      }

      // document indicator?
      if (INPUT.column() == 0 && Exp::DocIndicator().Matches(INPUT)) {
        if (params.onDocIndicator == BREAK) {
          break;
        }
        if (params.onDocIndicator == THROW) {
          throw ParserException(INPUT.mark(), ErrorMsg::DOC_IN_SCALAR);
        }
      }

      foundNonEmptyLine = true;
      pastOpeningBreak = true;

      // escaped newline? (only if we're escaping on slash)
      if (params.escape == '\\' && Exp::EscBreak().Matches(INPUT)) {
        // eat escape character and get out (but preserve trailing whitespace!)
        INPUT.get();
        lastNonWhitespaceChar = scalar.size();
        lastEscapedChar = scalar.size();
        escapedNewline = true;
        break;
      }

      // escape this?
      if (INPUT.peek() == params.escape) {
        scalar += Exp::Escape(INPUT);
        lastNonWhitespaceChar = scalar.size();
        lastEscapedChar = scalar.size();
        continue;
      }

      // otherwise, just add the damn character
      char ch = INPUT.get();
      scalar += ch;
      if (ch != ' ' && ch != '\t') {
        lastNonWhitespaceChar = scalar.size();
      }
    }

    // eof? if we're looking to eat something, then we throw
    if (!INPUT) {
      if (params.eatEnd) {
        throw ParserException(INPUT.mark(), ErrorMsg::EOF_IN_SCALAR);
      }
      break;
    }

    // doc indicator?
    if (params.onDocIndicator == BREAK && INPUT.column() == 0 &&
        Exp::DocIndicator().Matches(INPUT)) {
      break;
    }

    // are we done via character match?
    int n = params.end->Match(INPUT);
    if (n >= 0) {
      if (params.eatEnd) {
        INPUT.eat(n);
      }
      break;
    }

    // do we remove trailing whitespace?
    if (params.fold == FOLD_FLOW)
      scalar.erase(lastNonWhitespaceChar);

    // ********************************
    // Phase #2: eat line ending
    n = Exp::Break().Match(INPUT);
    INPUT.eat(n);

    // ********************************
    // Phase #3: scan initial spaces

    // first the required indentation
    while (INPUT.peek() == ' ' &&
           (INPUT.column() < params.indent ||
            (params.detectIndent && !foundNonEmptyLine)) &&
           !params.end->Matches(INPUT)) {
      INPUT.eat(1);
    }

    // update indent if we're auto-detecting
    if (params.detectIndent && !foundNonEmptyLine) {
      params.indent = std::max(params.indent, INPUT.column());
    }

    // and then the rest of the whitespace
    while (Exp::Blank().Matches(INPUT)) {
      // we check for tabs that masquerade as indentation
      if (INPUT.peek() == '\t' && INPUT.column() < params.indent &&
          params.onTabInIndentation == THROW) {
        throw ParserException(INPUT.mark(), ErrorMsg::TAB_IN_INDENTATION);
      }

      if (!params.eatLeadingWhitespace) {
        break;
      }

      if (params.end->Matches(INPUT)) {
        break;
      }

      INPUT.eat(1);
    }

    // was this an empty line?
    bool nextEmptyLine = Exp::Break().Matches(INPUT);
    bool nextMoreIndented = Exp::Blank().Matches(INPUT);
    if (params.fold == FOLD_BLOCK && foldedNewlineCount == 0 && nextEmptyLine)
      foldedNewlineStartedMoreIndented = moreIndented;

    // for block scalars, we always start with a newline, so we should ignore it
    // (not fold or keep)
    if (pastOpeningBreak) {
      switch (params.fold) {
        case DONT_FOLD:
          scalar += "\n";
          break;
        case FOLD_BLOCK:
          if (!emptyLine && !nextEmptyLine && !moreIndented &&
              !nextMoreIndented && INPUT.column() >= params.indent) {
            scalar += " ";
          } else if (nextEmptyLine) {
            foldedNewlineCount++;
          } else {
            scalar += "\n";
          }

          if (!nextEmptyLine && foldedNewlineCount > 0) {
            scalar += std::string(foldedNewlineCount - 1, '\n');
            if (foldedNewlineStartedMoreIndented ||
                nextMoreIndented | !foundNonEmptyLine) {
              scalar += "\n";
            }
            foldedNewlineCount = 0;
          }
          break;
        case FOLD_FLOW:
          if (nextEmptyLine) {
            scalar += "\n";
          } else if (!emptyLine && !escapedNewline) {
            scalar += " ";
          }
          break;
      }
    }

    emptyLine = nextEmptyLine;
    moreIndented = nextMoreIndented;
    pastOpeningBreak = true;

    // are we done via indentation?
    if (!emptyLine && INPUT.column() < params.indent) {
      params.leadingSpaces = true;
      break;
    }
  }

  // post-processing
  if (params.trimTrailingSpaces) {
    std::size_t pos = scalar.find_last_not_of(" \t");
    if (lastEscapedChar != std::string::npos) {
      if (pos < lastEscapedChar || pos == std::string::npos) {
        pos = lastEscapedChar;
      }
    }
    if (pos < scalar.size()) {
      scalar.erase(pos + 1);
    }
  }

  switch (params.chomp) {
    case CLIP: {
      std::size_t pos = scalar.find_last_not_of('\n');
      if (lastEscapedChar != std::string::npos) {
        if (pos < lastEscapedChar || pos == std::string::npos) {
          pos = lastEscapedChar;
        }
      }
      if (pos == std::string::npos) {
        scalar.erase();
      } else if (pos + 1 < scalar.size()) {
        scalar.erase(pos + 2);
      }
    } break;
    case STRIP: {
      std::size_t pos = scalar.find_last_not_of('\n');
      if (lastEscapedChar != std::string::npos) {
        if (pos < lastEscapedChar || pos == std::string::npos) {
          pos = lastEscapedChar;
        }
      }
      if (pos == std::string::npos) {
        scalar.erase();
      } else if (pos < scalar.size()) {
        scalar.erase(pos + 1);
      }
    } break;
    default:
      break;
  }

  return scalar;
}